

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Float pbrt::AngleBetween(Quaternion *q1,Quaternion *q2)

{
  undefined1 auVar1 [16];
  Float FVar2;
  float fVar3;
  undefined1 extraout_var_00 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Quaternion QVar11;
  Quaternion local_20;
  undefined1 extraout_var [60];
  undefined1 auVar7 [56];
  
  FVar2 = Dot(q1,q2);
  auVar10 = ZEXT856(0);
  if (0.0 <= FVar2) {
    auVar7 = extraout_var_00;
    QVar11 = Quaternion::operator-(q2,q1);
    auVar9._0_8_ = QVar11._8_8_;
    auVar9._8_56_ = auVar10;
    auVar6._0_8_ = QVar11.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    local_20 = (Quaternion)vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
    FVar2 = Length(&local_20);
    fVar3 = SafeASin(FVar2 * 0.5);
    fVar3 = fVar3 + fVar3;
  }
  else {
    auVar7 = extraout_var_00;
    QVar11 = Quaternion::operator+(q1,q2);
    auVar8._0_8_ = QVar11._8_8_;
    auVar8._8_56_ = auVar10;
    auVar4._0_8_ = QVar11.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar7;
    local_20 = (Quaternion)vmovlhps_avx(auVar4._0_16_,auVar8._0_16_);
    FVar2 = Length(&local_20);
    auVar5._0_4_ = SafeASin(FVar2 * 0.5);
    auVar5._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar5._0_16_,ZEXT416(0x40490fdb));
    fVar3 = auVar1._0_4_;
  }
  return fVar3;
}

Assistant:

PBRT_CPU_GPU
inline Float AngleBetween(const Quaternion &q1, const Quaternion &q2) {
    if (Dot(q1, q2) < 0)
        return Pi - 2 * SafeASin(Length(q1 + q2) / 2);
    else
        return 2 * SafeASin(Length(q2 - q1) / 2);
}